

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::formatToName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,deUint32 format)

{
  bool bVar1;
  Enum<int,_2UL> EVar2;
  GetNameFunc local_f8;
  int local_f0;
  string local_e8;
  string local_c8 [32];
  GetNameFunc local_a8;
  int local_a0;
  GetNameFunc local_98;
  int local_90;
  string local_88;
  string local_68 [48];
  undefined1 local_38 [8];
  string enumName;
  deUint32 format_local;
  
  enumName.field_2._12_4_ = SUB84(this,0);
  std::__cxx11::string::string((string *)local_38);
  bVar1 = glu::isCompressedFormat(enumName.field_2._12_4_);
  if (bVar1) {
    EVar2 = glu::getCompressedTextureFormatStr(enumName.field_2._12_4_);
    local_a8 = EVar2.m_getName;
    local_a0 = EVar2.m_value;
    local_98 = local_a8;
    local_90 = local_a0;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_98);
    std::__cxx11::string::substr((ulong)local_68,(ulong)&local_88);
    std::__cxx11::string::operator=((string *)local_38,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    EVar2 = glu::getUncompressedTextureFormatStr(enumName.field_2._12_4_);
    local_f8 = EVar2.m_getName;
    local_f0 = EVar2.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e8,&local_f8);
    std::__cxx11::string::substr((ulong)local_c8,(ulong)&local_e8);
    std::__cxx11::string::operator=((string *)local_38,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  de::toLower(__return_storage_ptr__,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string formatToName (deUint32 format)
{
	string enumName;

	if (glu::isCompressedFormat(format))
		enumName = glu::getCompressedTextureFormatStr(format).toString().substr(14); // Strip GL_COMPRESSED_
	else
		enumName = glu::getUncompressedTextureFormatStr(format).toString().substr(3); // Strip GL_

	return de::toLower(enumName);
}